

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bxdfs.cpp
# Opt level: O2

string * __thiscall
pbrt::BxDFHandle::ToString_abi_cxx11_(string *__return_storage_ptr__,BxDFHandle *this)

{
  ulong uVar1;
  ushort uVar2;
  uint uVar3;
  uint uVar4;
  DielectricInterfaceBxDF *this_00;
  ConductorBxDF *this_01;
  
  uVar1 = (this->
          super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::NormalizedFresnelBxDF>
          ).bits;
  uVar2 = (ushort)(uVar1 >> 0x30);
  uVar3 = (uint)uVar2;
  if ((uint)(uVar1 >> 0x31) < 3) {
    if (uVar3 < 3) {
      if (uVar3 == 2) {
        DiffuseBxDF::ToString_abi_cxx11_
                  (__return_storage_ptr__,(DiffuseBxDF *)(uVar1 & 0xffffffffffff));
      }
      else {
        IdealDiffuseBxDF::ToString_abi_cxx11_
                  (__return_storage_ptr__,(IdealDiffuseBxDF *)(uVar1 & 0xffffffffffff));
      }
    }
    else {
      this_00 = (DielectricInterfaceBxDF *)(uVar1 & 0xffffffffffff);
      if (uVar3 - 2 < 2) {
        LayeredBxDF<pbrt::DielectricInterfaceBxDF,pbrt::IdealDiffuseBxDF>::ToString_abi_cxx11_
                  (__return_storage_ptr__,this_00);
      }
      else if (uVar3 - 2 == 2) {
        LayeredBxDF<pbrt::DielectricInterfaceBxDF,pbrt::ConductorBxDF>::ToString_abi_cxx11_
                  (__return_storage_ptr__,this_00);
      }
      else {
        DielectricInterfaceBxDF::ToString_abi_cxx11_(__return_storage_ptr__,this_00);
      }
    }
  }
  else {
    uVar4 = uVar2 - 5;
    if (uVar4 < 3) {
      if (uVar4 == 2) {
        HairBxDF::ToString_abi_cxx11_(__return_storage_ptr__,(HairBxDF *)(uVar1 & 0xffffffffffff));
      }
      else {
        ThinDielectricBxDF::ToString_abi_cxx11_
                  (__return_storage_ptr__,(ThinDielectricBxDF *)(uVar1 & 0xffffffffffff));
      }
    }
    else {
      this_01 = (ConductorBxDF *)(uVar1 & 0xffffffffffff);
      if (uVar3 - 7 < 2) {
        MeasuredBxDF::ToString_abi_cxx11_(__return_storage_ptr__,(MeasuredBxDF *)this_01);
      }
      else if (uVar3 - 7 == 2) {
        ConductorBxDF::ToString_abi_cxx11_(__return_storage_ptr__,this_01);
      }
      else {
        NormalizedFresnelBxDF::ToString_abi_cxx11_
                  (__return_storage_ptr__,(NormalizedFresnelBxDF *)this_01);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string BxDFHandle::ToString() const {
    auto toStr = [](auto ptr) { return ptr->ToString(); };
    return DispatchCPU(toStr);
}